

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

void __thiscall UnifiedRegex::LoopNode::Emit(LoopNode *this,Compiler *compiler,CharCount *skipped)

{
  code *pcVar1;
  CharCount fixup_00;
  CharCount *pCVar2;
  bool bVar3;
  char16 cVar4;
  int iVar5;
  int iVar6;
  Label LVar7;
  uint uVar8;
  uint uVar9;
  Label LVar10;
  ThreadContext *this_00;
  undefined4 *puVar11;
  BeginLoopInst *this_01;
  RepeatLoopInst *this_02;
  ChompCharInst<(UnifiedRegex::ChompMode)0> *this_03;
  ChompCharInst<(UnifiedRegex::ChompMode)1> *this_04;
  ChompCharBoundedInst *this_05;
  ChompSetInst<(UnifiedRegex::ChompMode)0> *this_06;
  ChompSetInst<(UnifiedRegex::ChompMode)1> *this_07;
  ChompSetBoundedInst *this_08;
  ChompSetBoundedGroupLastCharInst *this_09;
  BeginLoopIfCharInst *this_10;
  BeginLoopIfSetInst *this_11;
  RepeatLoopIfCharInst *this_12;
  RepeatLoopIfSetInst *this_13;
  BeginLoopFixedInst *this_14;
  RepeatLoopFixedInst *this_15;
  LoopSetInst *this_16;
  LoopSetWithFollowFirstInst *this_17;
  BeginLoopFixedGroupLastIterationInst *this_18;
  RepeatLoopFixedGroupLastIterationInst *this_19;
  BeginGreedyLoopNoBacktrackInst *this_20;
  RepeatGreedyLoopNoBacktrackInst *this_21;
  OptMatchCharInst *this_22;
  OptMatchSetInst *this_23;
  MatchCharOrJumpInst *this_24;
  JumpIfNotCharInst *this_25;
  MatchSetOrJumpInst *this_26;
  JumpIfNotSetInst *this_27;
  TryMatchCharInst *this_28;
  TryMatchSetInst *this_29;
  TryIfCharInst *this_30;
  TryIfSetInst *this_31;
  TryInst *this_32;
  TryIfSetInst *i_4;
  TryMatchSetInst *i_3;
  CharCount bodySkipped_1;
  Label tryFixup;
  JumpIfNotSetInst *i_2;
  MatchSetOrJumpInst *i_1;
  CharCount bodySkipped;
  Label jumpFixup;
  Label fixup_3;
  Label beginLabel_4;
  Label fixup_2;
  Label beginLabel_3;
  DefineGroupNode *bodyGroup_1;
  Label fixup_1;
  Label beginLabel_2;
  BeginLoopIfSetInst *i;
  Label exitFixup;
  Label beginLabel_1;
  int maxBodyGroupId_1;
  int minBodyGroupId_1;
  DefineGroupNode *bodyGroup;
  Label fixup;
  Label beginLabel;
  int maxBodyGroupId;
  int minBodyGroupId;
  CharCount *skipped_local;
  Compiler *compiler_local;
  LoopNode *this_local;
  
  _maxBodyGroupId = skipped;
  skipped_local = (CharCount *)compiler;
  compiler_local = (Compiler *)this;
  this_00 = Js::ScriptContext::GetThreadContext(compiler->scriptContext);
  ThreadContext::ProbeStackNoDispose(this_00,0x6000,*(ScriptContext **)skipped_local,(PVOID)0x0);
  if (*_maxBodyGroupId != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0xf49,"(skipped == 0)","skipped == 0");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  switch(this->scheme) {
  case BeginEnd:
    beginLabel = (Label)*(ushort *)(*(long *)(skipped_local + 0xc) + 0xc);
    fixup = 0xffffffff;
    (*this->body->_vptr_Node[0x10])(this->body,*(undefined8 *)skipped_local,&beginLabel,&fixup);
    bodyGroup._4_4_ = Compiler::CurrentLabel((Compiler *)skipped_local);
    pCVar2 = skipped_local;
    this_01 = (BeginLoopInst *)Compiler::Emit((Compiler *)skipped_local,0x1c);
    iVar6 = Compiler::NextLoopId((Compiler *)skipped_local);
    BeginLoopInst::BeginLoopInst
              (this_01,iVar6,&this->repeats,
               (bool)(((byte)(*(uint *)&(this->super_Node).field_0xc >> 10) & 1 ^ 0xff) & 1),
               (bool)(((byte)(*(uint *)&this->body->field_0xc >> 9) & 1 ^ 0xff) & 1),beginLabel,
               fixup,(bool)(this->isGreedy & 1));
    bodyGroup._0_4_ =
         Compiler::GetFixup((Compiler *)pCVar2,&(this_01->super_BeginLoopMixin).exitLabel);
    (*this->body->_vptr_Node[0x11])(this->body,skipped_local,_maxBodyGroupId);
    this_02 = (RepeatLoopInst *)Compiler::Emit((Compiler *)skipped_local,5);
    RepeatLoopInst::RepeatLoopInst(this_02,bodyGroup._4_4_);
    pCVar2 = skipped_local;
    LVar7 = (Label)bodyGroup;
    LVar10 = Compiler::CurrentLabel((Compiler *)skipped_local);
    Compiler::DoFixup((Compiler *)pCVar2,LVar7,LVar10);
    break;
  case None:
    break;
  case Chomp:
    bVar3 = CharSet<char16_t>::IsSingleton(this->body->firstSet);
    if (bVar3) {
      if (((this->repeats).lower < 2) && (bVar3 = CountDomain::IsUnbounded(&this->repeats), bVar3))
      {
        if ((this->repeats).lower == 0) {
          this_03 = (ChompCharInst<(UnifiedRegex::ChompMode)0> *)
                    Compiler::Emit((Compiler *)skipped_local,3);
          cVar4 = CharSet<char16_t>::Singleton(this->body->firstSet);
          ChompCharInst<(UnifiedRegex::ChompMode)0>::ChompCharInst(this_03,cVar4);
        }
        else {
          this_04 = (ChompCharInst<(UnifiedRegex::ChompMode)1> *)
                    Compiler::Emit((Compiler *)skipped_local,3);
          cVar4 = CharSet<char16_t>::Singleton(this->body->firstSet);
          ChompCharInst<(UnifiedRegex::ChompMode)1>::ChompCharInst(this_04,cVar4);
        }
      }
      else {
        this_05 = (ChompCharBoundedInst *)Compiler::Emit((Compiler *)skipped_local,0xb);
        cVar4 = CharSet<char16_t>::Singleton(this->body->firstSet);
        ChompCharBoundedInst::ChompCharBoundedInst(this_05,cVar4,&this->repeats);
      }
    }
    else if (((this->repeats).lower < 2) &&
            (bVar3 = CountDomain::IsUnbounded(&this->repeats), bVar3)) {
      if ((this->repeats).lower == 0) {
        this_06 = (ChompSetInst<(UnifiedRegex::ChompMode)0> *)
                  Compiler::Emit((Compiler *)skipped_local,0x29);
        ChompSetInst<(UnifiedRegex::ChompMode)0>::ChompSetInst(this_06);
        RuntimeCharSet<char16_t>::CloneFrom
                  (&(this_06->super_SetMixin<false>).set,*(ArenaAllocator **)(skipped_local + 4),
                   this->body->firstSet);
      }
      else {
        this_07 = (ChompSetInst<(UnifiedRegex::ChompMode)1> *)
                  Compiler::Emit((Compiler *)skipped_local,0x29);
        ChompSetInst<(UnifiedRegex::ChompMode)1>::ChompSetInst(this_07);
        RuntimeCharSet<char16_t>::CloneFrom
                  (&(this_07->super_SetMixin<false>).set,*(ArenaAllocator **)(skipped_local + 4),
                   this->body->firstSet);
      }
    }
    else {
      this_08 = (ChompSetBoundedInst *)Compiler::Emit((Compiler *)skipped_local,0x31);
      ChompSetBoundedInst::ChompSetBoundedInst(this_08,&this->repeats);
      RuntimeCharSet<char16_t>::CloneFrom
                (&(this_08->super_SetMixin<false>).set,*(ArenaAllocator **)(skipped_local + 4),
                 this->body->firstSet);
    }
    break;
  case ChompGroupLastChar:
    if (this->body->tag != DefineGroup) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xf91,"(body->tag == DefineGroup)","body->tag == DefineGroup");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    _maxBodyGroupId_1 = this->body;
    this_09 = (ChompSetBoundedGroupLastCharInst *)Compiler::Emit((Compiler *)skipped_local,0x36);
    iVar5._0_2_ = _maxBodyGroupId_1[1].tag;
    iVar5._2_2_ = _maxBodyGroupId_1[1].features;
    ChompSetBoundedGroupLastCharInst::ChompSetBoundedGroupLastCharInst
              (this_09,&this->repeats,iVar5,(bool)(this->noNeedToSave & 1));
    RuntimeCharSet<char16_t>::CloneFrom
              (&(this_09->super_SetMixin<false>).set,*(ArenaAllocator **)(skipped_local + 4),
               this->body->firstSet);
    break;
  case Guarded:
    beginLabel_1 = (Label)*(ushort *)(*(long *)(skipped_local + 0xc) + 0xc);
    exitFixup = 0xffffffff;
    (*this->body->_vptr_Node[0x10])
              (this->body,*(undefined8 *)skipped_local,&beginLabel_1,&exitFixup);
    i._4_4_ = Compiler::CurrentLabel((Compiler *)skipped_local);
    bVar3 = CharSet<char16_t>::IsSingleton(this->body->firstSet);
    pCVar2 = skipped_local;
    if (bVar3) {
      this_10 = (BeginLoopIfCharInst *)Compiler::Emit((Compiler *)skipped_local,0x1d);
      cVar4 = CharSet<char16_t>::Singleton(this->body->firstSet);
      iVar6 = Compiler::NextLoopId((Compiler *)skipped_local);
      BeginLoopIfCharInst::BeginLoopIfCharInst
                (this_10,cVar4,iVar6,&this->repeats,
                 (bool)(((byte)(*(uint *)&(this->super_Node).field_0xc >> 10) & 1 ^ 0xff) & 1),
                 (bool)(((byte)(*(uint *)&this->body->field_0xc >> 9) & 1 ^ 0xff) & 1),beginLabel_1,
                 exitFixup);
      i._0_4_ = Compiler::GetFixup((Compiler *)pCVar2,&(this_10->super_BeginLoopMixin).exitLabel);
    }
    else {
      this_11 = (BeginLoopIfSetInst *)Compiler::Emit((Compiler *)skipped_local,0x43);
      iVar6 = Compiler::NextLoopId((Compiler *)skipped_local);
      BeginLoopIfSetInst::BeginLoopIfSetInst
                (this_11,iVar6,&this->repeats,
                 (bool)(((byte)(*(uint *)&(this->super_Node).field_0xc >> 10) & 1 ^ 0xff) & 1),
                 (bool)(((byte)(*(uint *)&this->body->field_0xc >> 9) & 1 ^ 0xff) & 1),beginLabel_1,
                 exitFixup);
      _fixup_1 = this_11;
      RuntimeCharSet<char16_t>::CloneFrom
                (&(this_11->super_SetMixin<false>).set,*(ArenaAllocator **)(skipped_local + 4),
                 this->body->firstSet);
      i._0_4_ = Compiler::GetFixup((Compiler *)skipped_local,
                                   &(_fixup_1->super_BeginLoopMixin).exitLabel);
    }
    (*this->body->_vptr_Node[0x11])(this->body,skipped_local,_maxBodyGroupId);
    bVar3 = CharSet<char16_t>::IsSingleton(this->body->firstSet);
    if (bVar3) {
      this_12 = (RepeatLoopIfCharInst *)Compiler::Emit((Compiler *)skipped_local,5);
      RepeatLoopIfCharInst::RepeatLoopIfCharInst(this_12,i._4_4_);
    }
    else {
      this_13 = (RepeatLoopIfSetInst *)Compiler::Emit((Compiler *)skipped_local,5);
      RepeatLoopIfSetInst::RepeatLoopIfSetInst(this_13,i._4_4_);
    }
    pCVar2 = skipped_local;
    LVar7 = (Label)i;
    LVar10 = Compiler::CurrentLabel((Compiler *)skipped_local);
    Compiler::DoFixup((Compiler *)pCVar2,LVar7,LVar10);
    break;
  case Fixed:
    bVar3 = Node::ContainsDefineGroup(this->body);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfc1,"(!body->ContainsDefineGroup())","!body->ContainsDefineGroup()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    bVar3 = CountDomain::IsFixed(&this->body->thisConsumes);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfc2,"(body->thisConsumes.IsFixed())","body->thisConsumes.IsFixed()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    if ((this->body->thisConsumes).lower == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfc3,"(body->thisConsumes.lower > 0)","body->thisConsumes.lower > 0");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    if ((*(uint *)&this->body->field_0xc >> 9 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfc4,"(body->isDeterministic)","body->isDeterministic");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    bodyGroup_1._4_4_ = Compiler::CurrentLabel((Compiler *)skipped_local);
    pCVar2 = skipped_local;
    this_14 = (BeginLoopFixedInst *)Compiler::Emit((Compiler *)skipped_local,0x17);
    iVar6 = Compiler::NextLoopId((Compiler *)skipped_local);
    BeginLoopFixedInst::BeginLoopFixedInst
              (this_14,iVar6,&this->repeats,
               (bool)(((byte)(*(uint *)&(this->super_Node).field_0xc >> 10) & 1 ^ 0xff) & 1),
               (this->body->thisConsumes).lower);
    bodyGroup_1._0_4_ =
         Compiler::GetFixup((Compiler *)pCVar2,&(this_14->super_BeginLoopMixin).exitLabel);
    (*this->body->_vptr_Node[0x11])(this->body,skipped_local,_maxBodyGroupId);
    this_15 = (RepeatLoopFixedInst *)Compiler::Emit((Compiler *)skipped_local,5);
    RepeatLoopFixedInst::RepeatLoopFixedInst(this_15,bodyGroup_1._4_4_);
    pCVar2 = skipped_local;
    LVar7 = (Label)bodyGroup_1;
    LVar10 = Compiler::CurrentLabel((Compiler *)skipped_local);
    Compiler::DoFixup((Compiler *)pCVar2,LVar7,LVar10);
    break;
  case FixedSet:
    bVar3 = Node::IsSimpleOneChar(this->body);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfd4,"(body->IsSimpleOneChar())","body->IsSimpleOneChar()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    if ((this->followFirst == L'\xffff') ||
       (bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,RegexOptBTPhase), bVar3)) {
      this_16 = (LoopSetInst *)Compiler::Emit((Compiler *)skipped_local,0x36);
      iVar6 = Compiler::NextLoopId((Compiler *)skipped_local);
      LoopSetInst::LoopSetInst
                (this_16,iVar6,&this->repeats,
                 (bool)(((byte)(*(uint *)&(this->super_Node).field_0xc >> 10) & 1 ^ 0xff) & 1));
      RuntimeCharSet<char16_t>::CloneFrom
                (&(this_16->super_SetMixin<false>).set,*(ArenaAllocator **)(skipped_local + 4),
                 this->body->firstSet);
    }
    else {
      this_17 = (LoopSetWithFollowFirstInst *)Compiler::Emit((Compiler *)skipped_local,0x38);
      iVar6 = Compiler::NextLoopId((Compiler *)skipped_local);
      LoopSetWithFollowFirstInst::LoopSetWithFollowFirstInst
                (this_17,iVar6,&this->repeats,
                 (bool)(((byte)(*(uint *)&(this->super_Node).field_0xc >> 10) & 1 ^ 0xff) & 1),
                 this->followFirst);
      RuntimeCharSet<char16_t>::CloneFrom
                (&(this_17->super_LoopSetInst).super_SetMixin<false>.set,
                 *(ArenaAllocator **)(skipped_local + 4),this->body->firstSet);
    }
    break;
  case FixedGroupLastIteration:
    if (this->body->tag != DefineGroup) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfea,"(body->tag == DefineGroup)","body->tag == DefineGroup");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    _fixup_2 = this->body;
    bVar3 = CountDomain::IsFixed(&this->body->thisConsumes);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfec,"(body->thisConsumes.IsFixed())","body->thisConsumes.IsFixed()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    if ((this->body->thisConsumes).lower == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfed,"(body->thisConsumes.lower > 0)","body->thisConsumes.lower > 0");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    if ((*(uint *)&this->body->field_0xc >> 9 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfee,"(body->isDeterministic)","body->isDeterministic");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    beginLabel_4 = Compiler::CurrentLabel((Compiler *)skipped_local);
    pCVar2 = skipped_local;
    this_18 = (BeginLoopFixedGroupLastIterationInst *)Compiler::Emit((Compiler *)skipped_local,0x1c)
    ;
    iVar5 = Compiler::NextLoopId((Compiler *)skipped_local);
    iVar6._0_2_ = _fixup_2[1].tag;
    iVar6._2_2_ = _fixup_2[1].features;
    BeginLoopFixedGroupLastIterationInst::BeginLoopFixedGroupLastIterationInst
              (this_18,iVar5,&this->repeats,
               (bool)(((byte)(*(uint *)&(this->super_Node).field_0xc >> 10) & 1 ^ 0xff) & 1),
               (this->body->thisConsumes).lower,iVar6,(bool)(this->noNeedToSave & 1));
    fixup_3 = Compiler::GetFixup((Compiler *)pCVar2,&(this_18->super_BeginLoopMixin).exitLabel);
    (**(code **)(*_fixup_2[1]._vptr_Node + 0x88))
              (_fixup_2[1]._vptr_Node,skipped_local,_maxBodyGroupId);
    this_19 = (RepeatLoopFixedGroupLastIterationInst *)Compiler::Emit((Compiler *)skipped_local,5);
    RepeatLoopFixedGroupLastIterationInst::RepeatLoopFixedGroupLastIterationInst
              (this_19,beginLabel_4);
    pCVar2 = skipped_local;
    LVar7 = fixup_3;
    LVar10 = Compiler::CurrentLabel((Compiler *)skipped_local);
    Compiler::DoFixup((Compiler *)pCVar2,LVar7,LVar10);
    break;
  case GreedyNoBacktrack:
    bVar3 = Node::ContainsDefineGroup(this->body);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1001,"(!body->ContainsDefineGroup())","!body->ContainsDefineGroup()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    if ((this->isGreedy & 1U) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1002,"(isGreedy)","isGreedy");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    if ((this->repeats).lower != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1003,"(repeats.lower == 0)","repeats.lower == 0");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    if ((this->repeats).upper != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1004,"(repeats.upper == CharCountFlag)","repeats.upper == CharCountFlag"
                        );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    if ((*(uint *)&this->body->field_0xc >> 9 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1005,"(body->isDeterministic)","body->isDeterministic");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    jumpFixup = Compiler::CurrentLabel((Compiler *)skipped_local);
    pCVar2 = skipped_local;
    this_20 = (BeginGreedyLoopNoBacktrackInst *)Compiler::Emit((Compiler *)skipped_local,9);
    iVar6 = Compiler::NextLoopId((Compiler *)skipped_local);
    BeginGreedyLoopNoBacktrackInst::BeginGreedyLoopNoBacktrackInst(this_20,iVar6);
    bodySkipped = Compiler::GetFixup((Compiler *)pCVar2,
                                     &(this_20->super_GreedyLoopNoBacktrackMixin).exitLabel);
    (*this->body->_vptr_Node[0x11])(this->body,skipped_local,_maxBodyGroupId);
    this_21 = (RepeatGreedyLoopNoBacktrackInst *)Compiler::Emit((Compiler *)skipped_local,5);
    RepeatGreedyLoopNoBacktrackInst::RepeatGreedyLoopNoBacktrackInst(this_21,jumpFixup);
    pCVar2 = skipped_local;
    fixup_00 = bodySkipped;
    LVar7 = Compiler::CurrentLabel((Compiler *)skipped_local);
    Compiler::DoFixup((Compiler *)pCVar2,fixup_00,LVar7);
    break;
  case Set:
    bVar3 = Node::ContainsDefineGroup(this->body);
    if ((bVar3) && (bVar3 = CountDomain::CouldMatchEmpty(&this->body->thisConsumes), bVar3)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1015,
                         "(!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty())",
                         "!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    bVar3 = CharSet<char16_t>::IsSingleton(this->body->firstSet);
    if (bVar3) {
      this_22 = (OptMatchCharInst *)Compiler::Emit((Compiler *)skipped_local,3);
      cVar4 = CharSet<char16_t>::Singleton(this->body->firstSet);
      OptMatchCharInst::OptMatchCharInst(this_22,cVar4);
    }
    else {
      this_23 = (OptMatchSetInst *)Compiler::Emit((Compiler *)skipped_local,0x29);
      OptMatchSetInst::OptMatchSetInst(this_23);
      RuntimeCharSet<char16_t>::CloneFrom
                (&(this_23->super_SetMixin<false>).set,*(ArenaAllocator **)(skipped_local + 4),
                 this->body->firstSet);
    }
    break;
  case Chain:
    bVar3 = Node::ContainsDefineGroup(this->body);
    if ((bVar3) && (bVar3 = CountDomain::CouldMatchEmpty(&this->body->thisConsumes), bVar3)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1027,
                         "(!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty())",
                         "!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    i_1._4_4_ = 0;
    i_1._0_4_ = 0;
    bVar3 = CharSet<char16_t>::IsSingleton(this->body->firstSet);
    if (bVar3) {
      uVar9 = (*this->body->_vptr_Node[0xb])(this->body,skipped_local);
      pCVar2 = skipped_local;
      if ((uVar9 & 1) == 0) {
        this_25 = (JumpIfNotCharInst *)Compiler::Emit((Compiler *)skipped_local,7);
        cVar4 = CharSet<char16_t>::Singleton(this->body->firstSet);
        JumpIfNotCharInst::JumpIfNotCharInst(this_25,cVar4);
        i_1._4_4_ = Compiler::GetFixup((Compiler *)pCVar2,&(this_25->super_JumpMixin).targetLabel);
      }
      else {
        this_24 = (MatchCharOrJumpInst *)Compiler::Emit((Compiler *)skipped_local,7);
        cVar4 = CharSet<char16_t>::Singleton(this->body->firstSet);
        MatchCharOrJumpInst::MatchCharOrJumpInst(this_24,cVar4);
        i_1._4_4_ = Compiler::GetFixup((Compiler *)pCVar2,&(this_24->super_JumpMixin).targetLabel);
        i_1._0_4_ = 1;
      }
    }
    else {
      uVar9 = (*this->body->_vptr_Node[0xb])(this->body,skipped_local);
      if ((uVar9 & 1) == 0) {
        this_27 = (JumpIfNotSetInst *)Compiler::Emit((Compiler *)skipped_local,0x2d);
        JumpIfNotSetInst::JumpIfNotSetInst(this_27);
        _bodySkipped_1 = this_27;
        RuntimeCharSet<char16_t>::CloneFrom
                  (&(this_27->super_SetMixin<false>).set,*(ArenaAllocator **)(skipped_local + 4),
                   this->body->firstSet);
        i_1._4_4_ = Compiler::GetFixup((Compiler *)skipped_local,
                                       &(_bodySkipped_1->super_JumpMixin).targetLabel);
      }
      else {
        this_26 = (MatchSetOrJumpInst *)Compiler::Emit((Compiler *)skipped_local,0x2d);
        MatchSetOrJumpInst::MatchSetOrJumpInst(this_26);
        i_2 = (JumpIfNotSetInst *)this_26;
        RuntimeCharSet<char16_t>::CloneFrom
                  (&(this_26->super_SetMixin<false>).set,*(ArenaAllocator **)(skipped_local + 4),
                   this->body->firstSet);
        i_1._4_4_ = Compiler::GetFixup((Compiler *)skipped_local,&(i_2->super_JumpMixin).targetLabel
                                      );
        i_1._0_4_ = 1;
      }
    }
    (*this->body->_vptr_Node[0x11])(this->body,skipped_local,&i_1);
    pCVar2 = skipped_local;
    LVar7 = i_1._4_4_;
    LVar10 = Compiler::CurrentLabel((Compiler *)skipped_local);
    Compiler::DoFixup((Compiler *)pCVar2,LVar7,LVar10);
    break;
  case Try:
    bVar3 = Node::ContainsDefineGroup(this->body);
    if ((bVar3) && (bVar3 = CountDomain::CouldMatchEmpty(&this->body->thisConsumes), bVar3)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1052,
                         "(!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty())",
                         "!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    i_3._4_4_ = 0;
    i_3._0_4_ = 0;
    bVar3 = CountDomain::CouldMatchEmpty(&this->body->thisConsumes);
    if ((bVar3) ||
       (((*(uint *)&this->body->field_0xc & 1) == 0 &&
        (uVar8 = CharSet<char16_t>::Count(this->body->firstSet), 0x14 < uVar8)))) {
      pCVar2 = skipped_local;
      this_32 = (TryInst *)Compiler::Emit((Compiler *)skipped_local,5);
      TryInst::TryInst(this_32);
      i_3._4_4_ = Compiler::GetFixup((Compiler *)pCVar2,&(this_32->super_TryMixin).failLabel);
    }
    else {
      uVar9 = (*this->body->_vptr_Node[0xb])(this->body,skipped_local);
      if ((uVar9 & 1) == 0) {
        bVar3 = CharSet<char16_t>::IsSingleton(this->body->firstSet);
        pCVar2 = skipped_local;
        if (bVar3) {
          this_30 = (TryIfCharInst *)Compiler::Emit((Compiler *)skipped_local,7);
          cVar4 = CharSet<char16_t>::Singleton(this->body->firstSet);
          TryIfCharInst::TryIfCharInst(this_30,cVar4);
          i_3._4_4_ = Compiler::GetFixup((Compiler *)pCVar2,&(this_30->super_TryMixin).failLabel);
        }
        else {
          this_31 = (TryIfSetInst *)Compiler::Emit((Compiler *)skipped_local,0x2d);
          TryIfSetInst::TryIfSetInst(this_31);
          RuntimeCharSet<char16_t>::CloneFrom
                    (&(this_31->super_SetMixin<false>).set,*(ArenaAllocator **)(skipped_local + 4),
                     this->body->firstSet);
          i_3._4_4_ = Compiler::GetFixup((Compiler *)skipped_local,
                                         &(this_31->super_TryMixin).failLabel);
        }
      }
      else {
        bVar3 = CharSet<char16_t>::IsSingleton(this->body->firstSet);
        pCVar2 = skipped_local;
        if (bVar3) {
          this_28 = (TryMatchCharInst *)Compiler::Emit((Compiler *)skipped_local,7);
          cVar4 = CharSet<char16_t>::Singleton(this->body->firstSet);
          TryMatchCharInst::TryMatchCharInst(this_28,cVar4);
          i_3._4_4_ = Compiler::GetFixup((Compiler *)pCVar2,&(this_28->super_TryMixin).failLabel);
        }
        else {
          this_29 = (TryMatchSetInst *)Compiler::Emit((Compiler *)skipped_local,0x2d);
          TryMatchSetInst::TryMatchSetInst(this_29);
          RuntimeCharSet<char16_t>::CloneFrom
                    (&(this_29->super_SetMixin<false>).set,*(ArenaAllocator **)(skipped_local + 4),
                     this->body->firstSet);
          i_3._4_4_ = Compiler::GetFixup((Compiler *)skipped_local,
                                         &(this_29->super_TryMixin).failLabel);
        }
        i_3._0_4_ = 1;
      }
    }
    (*this->body->_vptr_Node[0x11])(this->body,skipped_local,&i_3);
    pCVar2 = skipped_local;
    LVar7 = i_3._4_4_;
    LVar10 = Compiler::CurrentLabel((Compiler *)skipped_local);
    Compiler::DoFixup((Compiler *)pCVar2,LVar7,LVar10);
  }
  return;
}

Assistant:

void LoopNode::Emit(Compiler& compiler, CharCount& skipped)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        Assert(skipped == 0);

        switch (scheme)
        {
            case BeginEnd:
            {
                //
                // Compilation scheme:
                //
                //   Lloop: BeginLoop Lexit
                //          <loop body>
                //          RepeatLoop Lloop
                //   Lexit:
                //
                int minBodyGroupId = compiler.program->numGroups;
                int maxBodyGroupId = -1;
                body->AccumDefineGroups(compiler.scriptContext, minBodyGroupId, maxBodyGroupId);
                Label beginLabel = compiler.CurrentLabel();
                Label fixup = compiler.GetFixup(&EMIT(compiler, BeginLoopInst, compiler.NextLoopId(), repeats, !isNotInLoop, !body->isDeterministic, minBodyGroupId, maxBodyGroupId, isGreedy)->exitLabel);
                body->Emit(compiler, skipped);
                EMIT(compiler, RepeatLoopInst, beginLabel);
                compiler.DoFixup(fixup, compiler.CurrentLabel());
                break;
            }

            case None:
            {
                // Nothing to emit
                break;
            }

            case Chomp:
            {
                //
                // Compilation scheme:
                //
                //   Chomp(Char|Set)(Star|Plus|Bounded)
                //
                if(body->firstSet->IsSingleton())
                {
                    if(repeats.lower <= 1 && repeats.IsUnbounded())
                    {
                        if(repeats.lower == 0)
                            EMIT(compiler, ChompCharInst<ChompMode::Star>, body->firstSet->Singleton());
                        else
                            EMIT(compiler, ChompCharInst<ChompMode::Plus>, body->firstSet->Singleton());
                    }
                    else
                        EMIT(compiler, ChompCharBoundedInst, body->firstSet->Singleton(), repeats);
                }
                else
                {
                    if(repeats.lower <= 1 && repeats.IsUnbounded())
                    {
                        if(repeats.lower == 0)
                            EMIT(compiler, ChompSetInst<ChompMode::Star>)->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                        else
                            EMIT(compiler, ChompSetInst<ChompMode::Plus>)->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                    }
                    else
                        EMIT(compiler, ChompSetBoundedInst, repeats)->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                }
                break;
            }

            case ChompGroupLastChar:
            {
                //
                // Compilation scheme:
                //
                //   ChompSetGroup
                //
                Assert(body->tag == DefineGroup);
                DefineGroupNode* bodyGroup = (DefineGroupNode*)body;
                EMIT(compiler, ChompSetBoundedGroupLastCharInst, repeats, bodyGroup->groupId, noNeedToSave)->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                break;
            }

            case Guarded:
            {
                //
                // Compilation scheme:
                //
                //   Lloop: BeginLoopIf(Char|Set) Lexit
                //          <loop body>
                //          RepeatLoopIf(Char|Set) Lloop
                //   Lexit:
                //
                int minBodyGroupId = compiler.program->numGroups;
                int maxBodyGroupId = -1;
                body->AccumDefineGroups(compiler.scriptContext, minBodyGroupId, maxBodyGroupId);
                Label beginLabel = compiler.CurrentLabel();
                Label exitFixup;
                if (body->firstSet->IsSingleton())
                    exitFixup = compiler.GetFixup(&EMIT(compiler, BeginLoopIfCharInst, body->firstSet->Singleton(), compiler.NextLoopId(), repeats, !isNotInLoop, !body->isDeterministic, minBodyGroupId, maxBodyGroupId)->exitLabel);
                else
                {
                    BeginLoopIfSetInst* i = EMIT(compiler, BeginLoopIfSetInst, compiler.NextLoopId(), repeats, !isNotInLoop, !body->isDeterministic, minBodyGroupId, maxBodyGroupId);
                    i->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                    exitFixup = compiler.GetFixup(&i->exitLabel);
                }
                body->Emit(compiler, skipped);
                if (body->firstSet->IsSingleton())
                    EMIT(compiler, RepeatLoopIfCharInst, beginLabel);
                else
                    EMIT(compiler, RepeatLoopIfSetInst, beginLabel);
                compiler.DoFixup(exitFixup, compiler.CurrentLabel());
                break;
            }

            case Fixed:
            {
                //
                // Compilation scheme:
                //
                //   Lloop: BeginLoopFixed Lexit
                //          <loop body>
                //          RepeatLoopFixed Lloop
                //   Lexit:
                //
                Assert(!body->ContainsDefineGroup());
                Assert(body->thisConsumes.IsFixed());
                Assert(body->thisConsumes.lower > 0);
                Assert(body->isDeterministic);
                Label beginLabel = compiler.CurrentLabel();
                Label fixup = compiler.GetFixup(&EMIT(compiler, BeginLoopFixedInst, compiler.NextLoopId(), repeats, !isNotInLoop, body->thisConsumes.lower)->exitLabel);
                body->Emit(compiler, skipped);
                EMIT(compiler, RepeatLoopFixedInst, beginLabel);
                compiler.DoFixup(fixup, compiler.CurrentLabel());
                break;
            }

            case FixedSet:
            {
                //
                // Compilation scheme:
                //
                //   LoopSet
                //
                Assert(body->IsSimpleOneChar());
                if (followFirst == MaxChar || PHASE_OFF1(Js::RegexOptBTPhase))
                {
                    EMIT(compiler, LoopSetInst, compiler.NextLoopId(), repeats, !isNotInLoop)->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                }
                else
                {
                    EMIT(compiler, LoopSetWithFollowFirstInst, compiler.NextLoopId(), repeats, !isNotInLoop, followFirst)->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                }
                break;
            }

            case FixedGroupLastIteration:
            {
                //
                // Compilation scheme:
                //
                //   Lloop: BeginLoopFixedGroupLastIteration Lexit
                //          <loop body>
                //          RepeatLoopFixedGroupLastIteration Lloop
                //   Lexit:
                //
                Assert(body->tag == DefineGroup);
                DefineGroupNode* bodyGroup = (DefineGroupNode*)body;
                Assert(body->thisConsumes.IsFixed());
                Assert(body->thisConsumes.lower > 0);
                Assert(body->isDeterministic);
                Label beginLabel = compiler.CurrentLabel();
                Label fixup = compiler.GetFixup(&EMIT(compiler, BeginLoopFixedGroupLastIterationInst, compiler.NextLoopId(), repeats, !isNotInLoop, body->thisConsumes.lower, bodyGroup->groupId, noNeedToSave)->exitLabel);
                bodyGroup->body->Emit(compiler, skipped);
                EMIT(compiler, RepeatLoopFixedGroupLastIterationInst, beginLabel);
                compiler.DoFixup(fixup, compiler.CurrentLabel());
                break;
            }

            case GreedyNoBacktrack:
            {
                //
                // Compilation scheme:
                //
                //   Lloop: BeginGreedyLoopNoBacktrack Lexit
                //          <loop body>
                //          RepeatGreedyLoopNoBacktrack Lloop
                //   Lexit:
                //
                Assert(!body->ContainsDefineGroup());
                Assert(isGreedy);
                Assert(repeats.lower == 0);
                Assert(repeats.upper == CharCountFlag);
                Assert(body->isDeterministic);
                Label beginLabel = compiler.CurrentLabel();
                Label fixup = compiler.GetFixup(&EMIT(compiler, BeginGreedyLoopNoBacktrackInst, compiler.NextLoopId())->exitLabel);
                body->Emit(compiler, skipped);
                EMIT(compiler, RepeatGreedyLoopNoBacktrackInst, beginLabel);
                compiler.DoFixup(fixup, compiler.CurrentLabel());
                break;
            }

            case Set:
            {
                //
                // Compilation scheme:
                //
                //   OptMatch(Char|Set)
                //
                Assert(!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty());
                if (body->firstSet->IsSingleton())
                    EMIT(compiler, OptMatchCharInst, body->firstSet->Singleton());
                else
                    EMIT(compiler, OptMatchSetInst)->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                break;
            }

            case Chain:
            {
                //
                // Compilation scheme:
                //
                //          JumpIfNot(Char|Set) Lexit
                //          <body>
                //   Lexit:
                //
                //
                Assert(!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty());
                Label jumpFixup = 0;
                CharCount bodySkipped = 0;
                if (body->firstSet->IsSingleton())
                {
                    if (body->SupportsPrefixSkipping(compiler))
                    {
                        jumpFixup = compiler.GetFixup(&EMIT(compiler, MatchCharOrJumpInst, body->firstSet->Singleton())->targetLabel);
                        bodySkipped = 1;
                    }
                    else
                        jumpFixup = compiler.GetFixup(&EMIT(compiler, JumpIfNotCharInst, body->firstSet->Singleton())->targetLabel);
                }
                else
                {
                    if (body->SupportsPrefixSkipping(compiler))
                    {
                        MatchSetOrJumpInst* const i = EMIT(compiler, MatchSetOrJumpInst);
                        i->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                        jumpFixup = compiler.GetFixup(&i->targetLabel);
                        bodySkipped = 1;
                    }
                    else
                    {
                        JumpIfNotSetInst* const i = EMIT(compiler, JumpIfNotSetInst);
                        i->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                        jumpFixup = compiler.GetFixup(&i->targetLabel);
                    }
                }
                body->Emit(compiler, bodySkipped);
                compiler.DoFixup(jumpFixup, compiler.CurrentLabel());
                break;
            }

            case Try:
            {
                //
                // Compilation scheme:
                //
                //          Try((If|Match)(Char|Set))? Lexit
                //          <loop body>
                //   Lexit:
                //
                Assert(!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty());
                Label tryFixup = 0;
                CharCount bodySkipped = 0;
                // HEURISTIC: if the first set of the body is exact or small, and the
                //            body does not match empty, then it's probably worth using
                //            a Try(If|Match)(Char|Set)
                if (!body->thisConsumes.CouldMatchEmpty() &&
                    (body->isFirstExact || body->firstSet->Count() <= maxCharsForConditionalTry))
                {
                    if (body->SupportsPrefixSkipping(compiler))
                    {
                        if (body->firstSet->IsSingleton())
                            tryFixup = compiler.GetFixup(&EMIT(compiler, TryMatchCharInst, body->firstSet->Singleton())->failLabel);
                        else
                        {
                            TryMatchSetInst* const i = EMIT(compiler, TryMatchSetInst);
                            i->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                            tryFixup = compiler.GetFixup(&i->failLabel);
                        }
                        bodySkipped = 1;
                    }
                    else
                    {
                        if(body->firstSet->IsSingleton())
                            tryFixup = compiler.GetFixup(&EMIT(compiler, TryIfCharInst, body->firstSet->Singleton())->failLabel);
                        else
                        {
                            TryIfSetInst* const i = EMIT(compiler, TryIfSetInst);
                            i->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                            tryFixup = compiler.GetFixup(&i->failLabel);
                        }
                    }
                }
                else
                    tryFixup = compiler.GetFixup(&EMIT(compiler, TryInst)->failLabel);
                body->Emit(compiler, bodySkipped);
                // Fixup Try
                compiler.DoFixup(tryFixup, compiler.CurrentLabel());
                break;
            }
        }
    }